

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall icu_63::TZDBNames::~TZDBNames(TZDBNames *this)

{
  int local_1c;
  char **ppcStack_18;
  int32_t i;
  char **p;
  TZDBNames *this_local;
  
  this->_vptr_TZDBNames = (_func_int **)&PTR__TZDBNames_004ddb60;
  if (this->fNames != (UChar **)0x0) {
    uprv_free_63(this->fNames);
  }
  if (this->fRegions != (char **)0x0) {
    ppcStack_18 = this->fRegions;
    for (local_1c = 0; local_1c < this->fNumRegions; local_1c = local_1c + 1) {
      uprv_free_63(*ppcStack_18);
      ppcStack_18 = ppcStack_18 + 1;
    }
    uprv_free_63(this->fRegions);
  }
  return;
}

Assistant:

TZDBNames::~TZDBNames() {
    if (fNames != NULL) {
        uprv_free(fNames);
    }
    if (fRegions != NULL) {
        char **p = fRegions;
        for (int32_t i = 0; i < fNumRegions; p++, i++) {
            uprv_free(*p);
        }
        uprv_free(fRegions);
    }
}